

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_concat.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_2::detail::concat<std::__cxx11::string,char_const(&)[51],char_const*>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,char (*args) [51],char **args_1)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  concat_length<char_const*>((char *)this,(char **)args);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[51],_const_char_*,_0>
            (__return_storage_ptr__,(char (*) [51])this,(char **)args);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(std::forward<Args>(args)...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}